

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O0

void __thiscall Assimp::STEP::LazyObject::LazyInit(LazyObject *this)

{
  char *pcVar1;
  DB *pDVar2;
  ConversionSchema *pCVar3;
  ConvertObjectProc p_Var4;
  TypeError *this_00;
  element_type *peVar5;
  Object *pOVar6;
  TypeError *t;
  shared_ptr<const_Assimp::STEP::EXPRESS::LIST> conv_args;
  char *acopy;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  string local_40;
  ConvertObjectProc local_20;
  ConvertObjectProc proc;
  ConversionSchema *schema;
  LazyObject *this_local;
  
  schema = (ConversionSchema *)this;
  pCVar3 = DB::GetSchema(this->db);
  pcVar1 = this->type;
  proc = (ConvertObjectProc)pCVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pcVar1,&local_41);
  p_Var4 = EXPRESS::ConversionSchema::GetConverterProc(pCVar3,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = p_Var4;
  if (p_Var4 == (ConvertObjectProc)0x0) {
    acopy._6_1_ = 1;
    this_00 = (TypeError *)__cxa_allocate_exception(0x10);
    pcVar1 = this->type;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,pcVar1,(allocator<char> *)((long)&acopy + 7));
    std::operator+(&local_78,"unknown object type: ",&local_98);
    TypeError::TypeError(this_00,&local_78,this->id,0xffffffffffffffff);
    acopy._6_1_ = 0;
    __cxa_throw(this_00,&TypeError::typeinfo,TypeError::~TypeError);
  }
  conv_args.super___shared_ptr<const_Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->args;
  pCVar3 = DB::GetSchema(this->db);
  EXPRESS::LIST::Parse
            ((LIST *)&t,
             (char **)&conv_args.
                       super___shared_ptr<const_Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount,0xffffffffffffffff,pCVar3);
  if (this->args != (char *)0x0) {
    operator_delete__(this->args);
  }
  p_Var4 = local_20;
  this->args = (char *)0x0;
  pDVar2 = this->db;
  peVar5 = std::
           __shared_ptr_access<const_Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&t);
  pOVar6 = (*p_Var4)(pDVar2,peVar5);
  this->obj = pOVar6;
  this->db->evaluated_count = this->db->evaluated_count + 1;
  if (this->obj != (Object *)0x0) {
    STEP::Object::SetID(this->obj,this->id);
    std::shared_ptr<const_Assimp::STEP::EXPRESS::LIST>::~shared_ptr
              ((shared_ptr<const_Assimp::STEP::EXPRESS::LIST> *)&t);
    return;
  }
  __assert_fail("obj",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/STEPParser/STEPFileReader.cpp"
                ,0x22b,"void Assimp::STEP::LazyObject::LazyInit() const");
}

Assistant:

void STEP::LazyObject::LazyInit() const {
    const EXPRESS::ConversionSchema& schema = db.GetSchema();
    STEP::ConvertObjectProc proc = schema.GetConverterProc(type);

    if (!proc) {
        throw STEP::TypeError("unknown object type: " + std::string(type),id);
    }

    const char* acopy = args;
    std::shared_ptr<const EXPRESS::LIST> conv_args = EXPRESS::LIST::Parse(acopy,STEP::SyntaxError::LINE_NOT_SPECIFIED,&db.GetSchema());
    delete[] args;
    args = NULL;

    // if the converter fails, it should throw an exception, but it should never return NULL
    try {
        obj = proc(db,*conv_args);
    }
    catch(const TypeError& t) {
        // augment line and entity information
        throw TypeError(t.what(),id);
    }
    ++db.evaluated_count;
    ai_assert(obj);

    // store the original id in the object instance
    obj->SetID(id);
}